

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O3

REF_STATUS ref_interp_fill_empty_from_part(REF_INTERP ref_interp,REF_INT *from_part)

{
  int iVar1;
  REF_NODE ref_node;
  REF_GLOB *pRVar2;
  REF_ADJ pRVar3;
  uint uVar4;
  long lVar5;
  REF_INT *in_RDX;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  int iVar10;
  int iVar11;
  bool bVar12;
  REF_EDGE ref_edge;
  REF_BOOL local_3c;
  REF_EDGE local_38;
  
  ref_node = *(REF_NODE *)(from_part + 2);
  uVar4 = ref_edge_create(&local_38,(REF_GRID)from_part);
  if (uVar4 == 0) {
    iVar11 = 0;
    do {
      local_3c = 0;
      iVar8 = ref_node->max;
      if (0 < iVar8) {
        pRVar2 = ref_node->global;
        lVar5 = 0;
        iVar7 = 0;
        do {
          if (((-1 < pRVar2[lVar5]) && (ref_node->ref_mpi->id == ref_node->part[lVar5])) &&
             (in_RDX[lVar5] == -1)) {
            pRVar3 = local_38->adj;
            iVar8 = 1;
            if ((lVar5 < pRVar3->nnode) && (iVar10 = pRVar3->first[lVar5], iVar10 != -1)) {
              do {
                iVar1 = pRVar3->item[iVar10].ref;
                if (in_RDX[(local_38->e2n[(long)iVar1 * 2] - (int)lVar5) +
                           local_38->e2n[iVar1 * 2 + 1]] != -1) {
                  in_RDX[lVar5] =
                       in_RDX[(local_38->e2n[(long)iVar1 * 2] - (int)lVar5) +
                              local_38->e2n[iVar1 * 2 + 1]];
                  iVar8 = 0;
                  break;
                }
                iVar10 = pRVar3->item[iVar10].next;
              } while (iVar10 != -1);
            }
            bVar12 = iVar7 != 0;
            iVar7 = iVar8;
            if (bVar12) {
              iVar7 = 1;
            }
            iVar8 = ref_node->max;
            local_3c = iVar7;
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < iVar8);
      }
      uVar4 = ref_mpi_all_or((REF_MPI)ref_interp,&local_3c);
      if (uVar4 != 0) {
        pcVar9 = "mpi all or";
        uVar6 = 0xaa1;
        goto LAB_0017e38f;
      }
      uVar4 = ref_node_ghost_int(ref_node,in_RDX,1);
      if (uVar4 != 0) {
        pcVar9 = "ghost from_part";
        uVar6 = 0xaa2;
        goto LAB_0017e38f;
      }
      iVar11 = iVar11 + 1;
      if (iVar11 == 200) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0xaa4,"ref_interp_fill_empty_from_part","too many sweeps, stop inf loop");
        return 1;
      }
    } while (local_3c != 0);
    uVar4 = ref_edge_free(local_38);
    if (uVar4 == 0) {
      return 0;
    }
    pcVar9 = "ref_edge free";
    uVar6 = 0xaa7;
  }
  else {
    pcVar9 = "edges";
    uVar6 = 0xa94;
  }
LAB_0017e38f:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar6,
         "ref_interp_fill_empty_from_part",(ulong)uVar4,pcVar9);
  return uVar4;
}

Assistant:

REF_FCN static REF_STATUS ref_interp_fill_empty_from_part(REF_INTERP ref_interp,
                                                          REF_INT *from_part) {
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_GRID from_grid = ref_interp_from_grid(ref_interp);
  REF_NODE from_node = ref_grid_node(from_grid);
  REF_BOOL again;
  REF_INT nsweeps, node;
  REF_EDGE ref_edge;

  RSS(ref_edge_create(&ref_edge, from_grid), "edges");

  nsweeps = 0;
  again = REF_TRUE;
  while (again) {
    nsweeps++;
    again = REF_FALSE;
    each_ref_node_valid_node(from_node, node) {
      if (ref_node_owned(from_node, node) && REF_EMPTY == from_part[node]) {
        RSS(ref_interp_from_part_neighbor(ref_edge, from_part, node), "fill");
        again = again || REF_EMPTY == from_part[node];
      }
    }
    RSS(ref_mpi_all_or(ref_mpi, &again), "mpi all or");
    RSS(ref_node_ghost_int(from_node, from_part, 1), "ghost from_part");

    RUS(200, nsweeps, "too many sweeps, stop inf loop");
  }

  RSS(ref_edge_free(ref_edge), "ref_edge free");

  return REF_SUCCESS;
}